

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O3

void __thiscall Debugger::SetHookState(Debugger *this,shared_ptr<HookState> *newState)

{
  lua_State *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  int iVar3;
  __shared_ptr<Debugger,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  plVar1 = this->currentL;
  if (plVar1 != (lua_State *)0x0) {
    this_00 = (this->hookState).super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->hookState).super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->hookState).super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    peVar2 = (newState->super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_ptr<Debugger,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Debugger,void>
              (local_40,(__weak_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2> *)this);
    iVar3 = (*peVar2->_vptr_HookState[2])(peVar2,local_40,plVar1);
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if ((char)iVar3 != '\0') {
      (this->hookState).super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (newState->super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->hookState).super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &(newState->super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>)._M_refcount)
      ;
    }
  }
  return;
}

Assistant:

void Debugger::SetHookState(std::shared_ptr<HookState> newState) {
	if (!currentL) {
		return;
	}

	auto L = currentL;

	hookState = nullptr;
	if (newState->Start(shared_from_this(), L)) {
		hookState = newState;
	}
}